

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O2

uint64_t helper_iwmmxt_shufh_aarch64(CPUARMState_conflict *env,uint64_t x,uint32_t n)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = x >> ((byte)(n << 4) & 0x3f);
  uVar7 = uVar3 & 0xffff;
  bVar1 = (byte)n;
  uVar6 = x >> (bVar1 * '\x04' & 0x30);
  uVar5 = (uint)uVar6;
  uVar4 = x >> (bVar1 & 0x30);
  uVar2 = x >> (bVar1 >> 2 & 0x30);
  (env->iwmmxt).cregs[3] =
       ((uint)uVar4 & 0x8000) << 8 | uVar5 & 0x8000 | (uint)((short)uVar4 == 0) << 0x16 |
       (uint)(uVar7 == 0) << 6 | (uint)(uVar3 >> 8) & 0x80 | (uint)((short)uVar6 == 0) << 0xe |
       ((uint)uVar2 & 0x8000) << 0x10 | (uint)((short)uVar2 == 0) << 0x1e;
  return uVar2 << 0x30 | (uVar4 & 0xffff) << 0x20 | (ulong)(uVar5 << 0x10) | uVar7;
}

Assistant:

uint64_t HELPER(iwmmxt_shufh)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = (((x >> ((n << 4) & 0x30)) & 0xffff) << 0) |
        (((x >> ((n << 2) & 0x30)) & 0xffff) << 16) |
        (((x >> ((n << 0) & 0x30)) & 0xffff) << 32) |
        (((x >> ((n >> 2) & 0x30)) & 0xffff) << 48);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}